

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressedFRQI.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  pointer pdVar6;
  byte bVar7;
  vector<double,_std::allocator<double>_> *a;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  allocator_type local_539;
  size_t maxval;
  double local_530;
  vector<double,_std::allocator<double>_> data;
  size_t ncols;
  size_t nrows;
  vector<double,_std::allocator<double>_> state;
  QCircuit<double,_qclab::QObject<double>_> circuit;
  string fileNamePGM;
  string fileNameOut;
  string fileNameQASM;
  string local_440;
  value_type_conflict local_420;
  string local_418;
  string local_3f8;
  string fileNameIn;
  ofstream ostrm;
  stringstream qasm;
  ostream local_1a8 [376];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ostrm,argv[1],(allocator<char> *)&qasm);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ostrm,"--help");
    std::__cxx11::string::~string((string *)&ostrm);
    if (bVar2) {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,"QPIXL++: Compile quantum circuits for image representations")
      ;
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"***********************************************************")
      ;
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"compressedFRQI requires two mandatory input arguments, ");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"and two optional input arguments.");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"1. path to input PGM image file. Image data is expected");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"   in ASCII portable gray map format without comment.");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"2. path and name structure for all output data.");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"   For example : ");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"       /mypath/output ");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"       This will generate output.qasm, output.pgm, and ");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"       output_sim.pgm (depending on optional parameters)");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"       in /mypath/");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"3. (optional) compression level between 0 and 100 percent");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"   default compression level is 0.");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"4. (optional) simulate flag: 0 or 1 to determine if circuit")
      ;
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"   is simulated with QCLAB++, default is 0.");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      return 0;
    }
LAB_0010681c:
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "ERROR -- input and output filenames are required!");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"Use --help for more more .");
    std::endl<char,std::char_traits<char>>(poVar5);
    return -1;
  }
  if (argc < 3) goto LAB_0010681c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileNameIn,argv[1],(allocator<char> *)&ostrm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileNameOut,argv[2],(allocator<char> *)&ostrm);
  if (argc == 3) {
    local_530 = 0.0;
LAB_00106924:
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ostrm,argv[3],(allocator<char> *)&qasm);
    local_530 = std::__cxx11::stod((string *)&ostrm,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&ostrm);
    if ((uint)argc < 5) goto LAB_00106924;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ostrm,argv[4],(allocator<char> *)&qasm);
    iVar3 = std::__cxx11::stoi((string *)&ostrm,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&ostrm);
    bVar2 = iVar3 == 1;
  }
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  poVar5 = std::operator<<((ostream *)&std::cout," * Reading image data from file.. ");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::string((string *)&local_3f8,&fileNameIn);
  iVar3 = qpixl::readPGMA<std::vector<double,std::allocator<double>>>
                    (&local_3f8,&data,&nrows,&ncols,&maxval,2);
  std::__cxx11::string::~string((string *)&local_3f8);
  if (iVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- reading input image file");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar9 = -2;
    goto LAB_0010729d;
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar5 = std::operator<<(poVar5,"   Image statistics : ");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"     * number of rows             : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"     * number of columns          : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"     * maximum pixel value        : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"     * size of zero padded vector : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout," * Converting grayscale to angles.. ");
  std::endl<char,std::char_traits<char>>(poVar5);
  qpixl::frqi::convertToAngles<std::vector<double,std::allocator<double>>>(&data,maxval);
  poVar5 = std::operator<<((ostream *)&std::cout," * Compressing FRQI circuit.. ");
  std::endl<char,std::char_traits<char>>(poVar5);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&circuit,(frqi *)&data,a,local_530);
  iVar3 = circuit.nbQubits_ + -1;
  iVar11 = 0;
  iVar9 = 0;
  for (; circuit.gates_.
         super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         circuit.gates_.
         super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      circuit.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           circuit.gates_.
           super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    iVar4 = (**(((circuit.gates_.
                  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                super___uniq_ptr_impl<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_qclab::QObject<double>_*,_std::default_delete<qclab::QObject<double>_>_>
                .super__Head_base<0UL,_qclab::QObject<double>_*,_false>._M_head_impl)->_vptr_QObject
            )();
    iVar11 = iVar11 + (uint)(iVar4 != 1);
    iVar9 = iVar9 + (uint)(iVar4 == 1);
  }
  bVar7 = (byte)circuit.nbQubits_ - 1;
  poVar5 = std::operator<<((ostream *)&std::cout," * Writing compressed FRQI circuit to QASM.. ");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  qclab::QCircuit<double,_qclab::QObject<double>_>::toQASM(&circuit,local_1a8,0);
  fileNameQASM._M_dataplus._M_p = (pointer)&fileNameQASM.field_2;
  fileNameQASM._M_string_length = 0;
  fileNameQASM.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&fileNameQASM,&fileNameOut);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&fileNameQASM,".qasm");
  std::ofstream::ofstream(&ostrm,(string *)&fileNameQASM,_S_out);
  iVar4 = circuit.nbQubits_;
  poVar5 = std::operator<<((ostream *)&ostrm,"// Generated by QPIXL++");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"// https://github.com/QuantumComputingLab/qpixlpp");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"//   Circuit statistics : ");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"//     * number of qubits               : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,circuit.nbQubits_);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"//     * total number of gates          : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"//       - number of CNOTs              : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar11);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"//       - number of Ry gates           : ");
  iVar9 = iVar9 - iVar3;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"//       - number of Hadamard gates     : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"//     * Compression setting            : ");
  poVar5 = std::ostream::_M_insert<double>(local_530);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"//       - CNOT compression ratio [%]   : ");
  dVar12 = (double)(1 << (bVar7 & 0x1f));
  dVar13 = (1.0 - (double)iVar11 / dVar12) * 100.0;
  poVar5 = std::ostream::_M_insert<double>(dVar13);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"//       - Ry compression ratio [%]     : ");
  dVar12 = (1.0 - (double)iVar9 / dVar12) * 100.0;
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"OPENQASM 2.0;");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"include \"qelib1.inc\";");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"qreg q[");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  poVar5 = std::operator<<(poVar5,"];");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar5,(string *)&fileNamePGM);
  std::__cxx11::string::~string((string *)&fileNamePGM);
  std::ofstream::close();
  lVar1 = std::cout;
  *(uint *)(atan2f + *(long *)(std::cout + -0x18)) =
       *(uint *)(atan2f + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 1;
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar5 = std::operator<<(poVar5,"   Circuit statistics : ");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"     * number of qubits               : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,circuit.nbQubits_);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"     * total number of gates          : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"       - number of CNOTs              : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar11);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"       - number of Ry gates           : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"       - number of Hadamard gates     : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"     * Compression setting            : ");
  poVar5 = std::ostream::_M_insert<double>(local_530);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"       - CNOT compression ratio [%]   : ");
  poVar5 = std::ostream::_M_insert<double>(dVar13);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"       - Ry compression ratio [%]     : ");
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           " * Converting compressed data to grayscale image.. ");
  std::endl<char,std::char_traits<char>>(poVar5);
  qpixl::frqi::invGrayPermutation<std::vector<double,std::allocator<double>>>(&data);
  qpixl::frqi::isfwht<std::vector<double,std::allocator<double>>>(&data);
  for (pdVar6 = data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 != data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    *pdVar6 = *pdVar6 * 0.5;
  }
  qpixl::frqi::convertToGrayscale<std::vector<double,std::allocator<double>>>(&data,maxval);
  poVar5 = std::operator<<((ostream *)&std::cout," * Writing compressed image to file.. ");
  std::endl<char,std::char_traits<char>>(poVar5);
  fileNamePGM._M_dataplus._M_p = (pointer)&fileNamePGM.field_2;
  fileNamePGM._M_string_length = 0;
  fileNamePGM.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&fileNamePGM,&fileNameOut);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&fileNamePGM,".pgm");
  std::__cxx11::string::string((string *)&local_418,&fileNamePGM);
  iVar3 = qpixl::writePGMA<std::vector<double,std::allocator<double>>>
                    (&local_418,&data,nrows,ncols,maxval,2);
  std::__cxx11::string::~string((string *)&local_418);
  if (iVar3 == 0) {
    if (bVar2) {
      local_420 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&state,1L << ((byte)circuit.nbQubits_ & 0x3f),&local_420,&local_539);
      *state.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 1.0;
      poVar5 = std::operator<<((ostream *)&std::cout," * Simulating the compressed FRQI circuit.. ")
      ;
      std::endl<char,std::char_traits<char>>(poVar5);
      qclab::QCircuit<double,_qclab::QObject<double>_>::simulate(&circuit,&state);
      for (uVar8 = 0;
          uVar10 = (long)state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3, uVar8 < uVar10; uVar8 = uVar8 + 2) {
        dVar12 = atan2(state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8 + 1],
                       state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8]);
        *(double *)
         ((long)state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + uVar8 * 4) = dVar12;
      }
      std::vector<double,_std::allocator<double>_>::resize(&state,uVar10 >> 1);
      qpixl::frqi::convertToGrayscale<std::vector<double,std::allocator<double>>>(&state,maxval);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               " * Writing simulated compressed image to file.. ");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&fileNameOut,"_sim.pgm");
      std::__cxx11::string::string((string *)&local_440,&fileNameOut);
      iVar3 = qpixl::writePGMA<std::vector<double,std::allocator<double>>>
                        (&local_440,&state,nrows,ncols,maxval,2);
      std::__cxx11::string::~string((string *)&local_440);
      if (iVar3 == 0) {
        iVar9 = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- writing simulated image file");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar9 = -4;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&state.super__Vector_base<double,_std::allocator<double>_>);
      if (iVar3 != 0) goto LAB_0010725f;
    }
    iVar9 = 0;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- writing compressed image file");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar9 = -3;
  }
LAB_0010725f:
  std::__cxx11::string::~string((string *)&fileNamePGM);
  std::ofstream::~ofstream(&ostrm);
  std::__cxx11::string::~string((string *)&fileNameQASM);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit(&circuit);
LAB_0010729d:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&fileNameOut);
  std::__cxx11::string::~string((string *)&fileNameIn);
  return iVar9;
}

Assistant:

int main( int argc , char *argv[] ) {

  // parse input arguments
  if ( argc == 2 ) {
    if ( std::string(argv[1]) == "--help" ) {
      std::cout << std::endl
                << "QPIXL++: Compile quantum circuits for image representations"
                << std::endl
                << "***********************************************************"
                << std::endl << std::endl
                << "compressedFRQI requires two mandatory input arguments, "
                << std::endl << "and two optional input arguments."
                << std::endl << std::endl
                << "1. path to input PGM image file. Image data is expected"
                << std::endl
                << "   in ASCII portable gray map format without comment."
                << std::endl << std::endl
                << "2. path and name structure for all output data."
                << std::endl
                << "   For example : " << std::endl
                << "       /mypath/output " << std::endl
                << "       This will generate output.qasm, output.pgm, and "
                << std::endl
                << "       output_sim.pgm (depending on optional parameters)"
                << std::endl
                << "       in /mypath/"
                << std::endl << std::endl
                << "3. (optional) compression level between 0 and 100 percent"
                << std::endl
                << "   default compression level is 0."
                << std::endl << std::endl
                << "4. (optional) simulate flag: 0 or 1 to determine if circuit"
                << std::endl
                << "   is simulated with QCLAB++, default is 0."
                << std::endl << std::endl ;
      return 0 ;
    }
  }
  if ( argc < 3 ) {
    std::cerr << "ERROR -- input and output filenames are required!" 
              << std::endl 
              << "Use --help for more more ."
              << std::endl ;
    return -1 ;
  }
  std::string fileNameIn(  argv[1] ) ;
  std::string fileNameOut( argv[2] ) ;
  double  compr  = 0 ; if ( argc > 3 ) compr  = std::stod( argv[3] ) ;
  int sim = 0 ; if ( argc > 4 ) sim = std::stoi( argv[4] ) ;

  // Read grayscale image data
  std::vector< double > data ;
  size_t nrows, ncols, maxval ;
  int s, zeroPad = 2 ;
  std::cout << " * Reading image data from file.. " << std::endl ;
  s = qpixl::readPGMA(fileNameIn , data , nrows , ncols , maxval , zeroPad) ;

  if ( s != 0 ) {
    std::cerr << "ERROR -- reading input image file" << std::endl;
    return -2 ;
  }

  // Image statistics
  std::cout << std::endl
              << "   Image statistics : " << std::endl
              << "     * number of rows             : " << nrows << std::endl
              << "     * number of columns          : " << ncols << std::endl
              << "     * maximum pixel value        : " << maxval << std::endl
              << "     * size of zero padded vector : " << data.size() 
              << std::endl << std::endl ;
    
  // Convert data to angles for FRQI
  std::cout << " * Converting grayscale to angles.. " << std::endl ;
  qpixl::frqi::convertToAngles( data , maxval ) ;

  // Create compressed FRQI circuit
  std::cout << " * Compressing FRQI circuit.. " << std::endl ;
  auto circuit = qpixl::frqi::compressedFRQICircuit( data , compr ) ;

  // Count CNOTs and single qubit gates in FRQI circuit
  int nCNOT = 0, nRY = 0 ;
  const int nH = circuit.nbQubits() - 1 ;
  using citer  = typename qclab::QCircuit< double >::const_iterator ;
  for ( citer it = circuit.begin(); it !=circuit.end(); it++ ) {
    if ( (*it)->nbQubits() == 1 ) nRY += 1 ;
    else nCNOT += 1 ;
  }
  nRY -= nH ;
  
  const double maxgates = int(1)<<(circuit.nbQubits()-1) ;

  // Write QASM to file
  std::cout << " * Writing compressed FRQI circuit to QASM.. " << std::endl ;
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::string fileNameQASM ;
  fileNameQASM.append( fileNameOut ) ;
  fileNameQASM.append( ".qasm" ) ;
  std::ofstream ostrm( fileNameQASM , std::ios::out ) ;
  const int N = circuit.nbQubits() ;
  ostrm << "// Generated by QPIXL++" << std::endl
        << "// https://github.com/QuantumComputingLab/qpixlpp" << std::endl
        << std::endl << std::endl
        << "//   Circuit statistics : " << std::endl
        << "//     * number of qubits               : " 
        << circuit.nbQubits() << std::endl
        << "//     * total number of gates          : " << circuit.nbGates()
        << std::endl
        << "//       - number of CNOTs              : " << nCNOT 
        << std::endl
        << "//       - number of Ry gates           : " << nRY 
        << std::endl
        << "//       - number of Hadamard gates     : " << nH 
        << std::endl
        << "//     * Compression setting            : " << compr
        << std::endl
        << "//       - CNOT compression ratio [%]   : " 
        << (1.0 - (double(nCNOT)/maxgates))*100
        << std::endl
        << "//       - Ry compression ratio [%]     : " 
        << (1.0 - (double(nRY)/maxgates))*100
        << std::endl << std::endl
        << "OPENQASM 2.0;" << std::endl
        << "include \"qelib1.inc\";" << std::endl << std::endl
        << "qreg q[" << N << "];" << std::endl
        << qasm.str() ;
  ostrm.close() ;

  // Circuit statistics
  std::cout << std::fixed ;
  std::cout << std::setprecision(1) ;
  std::cout << std::endl
            << "   Circuit statistics : " << std::endl
            << "     * number of qubits               : " 
            << circuit.nbQubits() << std::endl
            << "     * total number of gates          : " << circuit.nbGates()
            << std::endl
            << "       - number of CNOTs              : " << nCNOT 
            << std::endl
            << "       - number of Ry gates           : " << nRY
            << std::endl
            << "       - number of Hadamard gates     : " << nH 
            << std::endl
            << "     * Compression setting            : " << compr
            << std::endl
            << "       - CNOT compression ratio [%]   : " 
            << (1.0 - (double(nCNOT)/maxgates))*100
            << std::endl
            << "       - Ry compression ratio [%]     : " 
            << (1.0 - (double(nRY)/maxgates))*100
            << std::endl << std::endl ;

  // Transform data back to binary order, inverse FWHT, and grayscale map
  std::cout << " * Converting compressed data to grayscale image.. " 
            << std::endl ;

  qpixl::frqi::invGrayPermutation( data ) ;
  qpixl::frqi::isfwht( data ) ; 
  std::for_each( data.begin(), data.end(), []( double& n ){ n /= 2; } ) ;       
  qpixl::frqi::convertToGrayscale( data , maxval ) ;

  // Write image data to PGM
  std::cout << " * Writing compressed image to file.. " << std::endl ;
  std::string fileNamePGM ;
  fileNamePGM.append( fileNameOut ) ;
  fileNamePGM.append( ".pgm" ) ;
  s = qpixl::writePGMA(fileNamePGM , data , nrows , ncols , maxval ,
                       zeroPad) ;

  if ( s != 0 ) {
    std::cerr << "ERROR -- writing compressed image file" << std::endl;
    return -3 ;
  }

  // Simulate the circuit
  if ( sim == 1 ) { 

    // Initial state vector
    std::vector< double > state( (size_t(1)<<circuit.nbQubits()) , 0.0 );
    state[0] = 1.0 ;
    
    // Simulate
    std::cout << " * Simulating the compressed FRQI circuit.. " << std::endl ;
    circuit.simulate( state ) ;
    
    // Recover simulated image data from state vector
    for ( int i = 0; i < state.size(); i+=2 ) {
      state[i/2] = std::atan2( state[i+1] , state[i] ) ;
    }
    state.resize( state.size()/2 ) ;
    qpixl::frqi::convertToGrayscale( state , maxval ) ;

    // Write simulated image data to PGM
    std::cout << " * Writing simulated compressed image to file.. " 
              << std::endl ;
    fileNameOut.append( "_sim.pgm" ) ;
    s = qpixl::writePGMA(fileNameOut , state , nrows , ncols , maxval , 
                         zeroPad) ;

    if ( s != 0 ) {
      std::cerr << "ERROR -- writing simulated image file" << std::endl;
      return -4 ;
    }
  }

  // successful
  return 0 ;    
    
}